

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t c4::yml::anon_unknown_0::_count_resolved_tags_size(Tree *t,size_t node)

{
  NodeType_e NVar1;
  size_t i;
  NodeData *pNVar2;
  csubstr *pcVar3;
  size_t sVar4;
  size_t sVar5;
  
  i = Tree::first_child(t,node);
  sVar5 = 0;
  for (; i != 0xffffffffffffffff; i = Tree::next_sibling(t,i)) {
    pNVar2 = Tree::_p(t,i);
    if (((pNVar2->m_type).type & KEY) != NOTYPE) {
      pNVar2 = Tree::_p(t,i);
      if ((~(int)(pNVar2->m_type).type & 0x402U) == 0) {
        pcVar3 = Tree::key_tag(t,i);
        sVar4 = Tree::resolve_tag(t,(substr)ZEXT816(0),*pcVar3,i);
        sVar5 = sVar5 + sVar4;
      }
    }
    pNVar2 = Tree::_p(t,i);
    if (((pNVar2->m_type).type & VAL) != NOTYPE) {
      pNVar2 = Tree::_p(t,i);
      NVar1 = (pNVar2->m_type).type;
      if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 0xb & 1) != 0) {
        pcVar3 = Tree::val_tag(t,i);
        sVar4 = Tree::resolve_tag(t,(substr)ZEXT816(0),*pcVar3,i);
        sVar5 = sVar5 + sVar4;
      }
    }
    sVar4 = _count_resolved_tags_size(t,i);
    sVar5 = sVar5 + sVar4;
  }
  return sVar5;
}

Assistant:

size_t _count_resolved_tags_size(Tree const* t, size_t node)
{
    size_t sz = 0;
    for(size_t child = t->first_child(node); child != NONE; child = t->next_sibling(child))
    {
        if(t->has_key(child) && t->has_key_tag(child))
            sz += t->resolve_tag(substr{}, t->key_tag(child), child);
        if(t->has_val(child) && t->has_val_tag(child))
            sz += t->resolve_tag(substr{}, t->val_tag(child), child);
        sz += _count_resolved_tags_size(t, child);
    }
    return sz;
}